

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O1

void __thiscall
estl::vector_s<unsigned_int,_5UL>::vector_s
          (vector_s<unsigned_int,_5UL> *this,size_type count,uint *value)

{
  size_type sVar1;
  range_error *this_00;
  
  this->size_ = 0;
  this->data_ptr_ = (pointer)this->data_;
  if (5 < count) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"cas::vector_s constructing beyond capacity.");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  sVar1 = count;
  if (count != 0) {
    do {
      *(uint *)(this->data_ + sVar1 * 4 + -4) = *value;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
  }
  this->size_ = count;
  return;
}

Assistant:

vector_s(size_type count, const T& value)
    {
        if (count > capacity()) {
            ESTL_THROW(std::range_error, "cas::vector_s constructing beyond capacity.");
        }
        for (size_t i = count; i > 0; ) {
            --i;
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(value);
        }
        size_ = count;
    }